

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::addClause_(Solver *this,vec<Minisat::Lit,_int> *ps)

{
  uint uVar1;
  Lit *pLVar2;
  lbool *plVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  CRef CVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  byte bVar15;
  byte bVar16;
  CRef cr;
  CRef local_34;
  
  if ((this->trail_lim).sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x9c,"bool Minisat::Solver::addClause_(vec<Lit> &)");
  }
  if (this->ok == true) {
    sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(ps->data,ps->sz);
    bVar7 = l_False;
    bVar6 = l_True;
    iVar8 = ps->sz;
    if (iVar8 < 1) {
      if (iVar8 < 0) goto LAB_0010983b;
    }
    else {
      pLVar2 = ps->data;
      plVar3 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
               data;
      bVar4 = l_True & 2;
      bVar5 = l_False & 2;
      lVar11 = 0;
      uVar14 = 0xfffffffe;
      iVar13 = 0;
      do {
        uVar1 = pLVar2[lVar11].x;
        if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz
            <= (int)uVar1 >> 1) {
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                        ,0x27,
                        "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        bVar15 = plVar3[(int)uVar1 >> 1].value;
        bVar16 = (byte)uVar1 & 1 ^ bVar15;
        bVar15 = bVar15 & 2;
        if (bVar16 == bVar6 && bVar4 == 0 || (bVar15 & bVar6) != 0) {
          return true;
        }
        if ((uVar1 ^ uVar14) == 1) {
          return true;
        }
        if (((bVar16 != bVar7 || bVar5 != 0) && (bVar15 & bVar7) == 0) && (uVar1 != uVar14)) {
          lVar10 = (long)iVar13;
          iVar13 = iVar13 + 1;
          pLVar2[lVar10].x = uVar1;
          iVar8 = ps->sz;
          uVar14 = uVar1;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar8);
      iVar12 = (int)lVar11 - iVar13;
      if (iVar8 < iVar12) {
LAB_0010983b:
        __assert_fail("nelems <= sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Vec.h"
                      ,0x41,
                      "void Minisat::vec<Minisat::Lit>::shrink(Size) [T = Minisat::Lit, _Size = int]"
                     );
      }
      if (0 < iVar12) {
        iVar8 = (iVar8 + iVar13) - (int)lVar11;
        ps->sz = iVar8;
      }
      if (iVar8 == 1) {
        uncheckedEnqueue(this,(Lit)ps->data->x,0xffffffff);
        CVar9 = propagate(this);
        this->ok = CVar9 == 0xffffffff;
        return CVar9 == 0xffffffff;
      }
      if (iVar8 != 0) {
        local_34 = ClauseAllocator::alloc(&this->ca,ps,false);
        vec<unsigned_int,_int>::push(&this->clauses,&local_34);
        attachClause(this,local_34);
        return true;
      }
    }
    this->ok = false;
  }
  return false;
}

Assistant:

bool Solver::addClause_(vec<Lit>& ps)
{
    assert(decisionLevel() == 0);
    if (!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);
    Lit p; int i, j;
    for (i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if (value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if (value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if (ps.size() == 0)
        return ok = false;
    else if (ps.size() == 1){
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    }else{
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}